

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesMemoryGetProperties(zes_mem_handle_t hMemory,zes_mem_properties_t *pProperties)

{
  zes_pfnMemoryGetProperties_t pfnGetProperties;
  dditable_t *dditable;
  ze_result_t result;
  zes_mem_properties_t *pProperties_local;
  zes_mem_handle_t hMemory_local;
  
  if (*(code **)(*(long *)(hMemory + 8) + 0xbc0) == (code *)0x0) {
    hMemory_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hMemory_local._4_4_ =
         (**(code **)(*(long *)(hMemory + 8) + 0xbc0))(*(undefined8 *)hMemory,pProperties);
  }
  return hMemory_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesMemoryGetProperties(
        zes_mem_handle_t hMemory,                       ///< [in] Handle for the component.
        zes_mem_properties_t* pProperties               ///< [in,out] Will contain memory properties.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_mem_object_t*>( hMemory )->dditable;
        auto pfnGetProperties = dditable->zes.Memory.pfnGetProperties;
        if( nullptr == pfnGetProperties )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMemory = reinterpret_cast<zes_mem_object_t*>( hMemory )->handle;

        // forward to device-driver
        result = pfnGetProperties( hMemory, pProperties );

        return result;
    }